

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3EvalTestExpr(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pRc)

{
  uint uVar1;
  Fts3DeferredToken *pFVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  Fts3Expr *pFVar7;
  Fts3DeferredToken **ppFVar8;
  Fts3Phrase *pFVar9;
  int iVar10;
  Fts3Expr *pFVar11;
  ulong uVar12;
  uint uVar13;
  size_t __n;
  Fts3Expr *p;
  ulong uVar14;
  long in_FS_OFFSET;
  bool bVar15;
  char *local_70;
  char *p2;
  char *p1;
  char *aPoslist;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar15 = true;
  if (*pRc != 0) goto LAB_001b4b38;
  switch(pExpr->eType) {
  case 1:
  case 3:
    iVar3 = fts3EvalTestExpr(pCsr,pExpr->pLeft,pRc);
    if ((iVar3 != 0) && (iVar3 = fts3EvalTestExpr(pCsr,pExpr->pRight,pRc), iVar3 != 0)) {
      if (((*pRc != 0) || (pExpr->eType != 1)) ||
         ((pExpr->pParent != (Fts3Expr *)0x0 && (pExpr->pParent->eType == 1)))) goto LAB_001b4b38;
      lVar4 = 0;
      pFVar11 = pExpr;
      while (pFVar11->pLeft != (Fts3Expr *)0x0) {
        lVar4 = lVar4 + (pFVar11->pRight->pPhrase->doclist).nList;
        pFVar11 = pFVar11->pLeft;
      }
      pcVar6 = (char *)sqlite3_malloc64((lVar4 + (pFVar11->pPhrase->doclist).nList) * 2 + 10);
      if (pcVar6 == (char *)0x0) {
        *pRc = 7;
        sqlite3_free((void *)0x0);
      }
      else {
        aPoslist = (pFVar11->pPhrase->doclist).pList;
        p1 = (char *)CONCAT44(p1._4_4_,pFVar11->pPhrase->nToken);
        iVar3 = 1;
        while (((iVar3 != 0 && (pFVar11 = pFVar11->pParent, pFVar11 != (Fts3Expr *)0x0)) &&
               (pFVar11->eType == 1))) {
          iVar3 = fts3EvalNearTrim(pFVar11->nNear,pcVar6,&aPoslist,(int *)&p1,
                                   pFVar11->pRight->pPhrase);
        }
        pFVar9 = pExpr->pRight->pPhrase;
        aPoslist = (pFVar9->doclist).pList;
        p1 = (char *)CONCAT44(p1._4_4_,pFVar9->nToken);
        pFVar11 = pExpr;
        while ((pFVar11 = pFVar11->pLeft, pFVar11 != (Fts3Expr *)0x0 && (iVar3 != 0))) {
          pFVar7 = pFVar11;
          if (pFVar11->eType == 1) {
            pFVar7 = pFVar11->pRight;
          }
          iVar3 = fts3EvalNearTrim(pFVar11->pParent->nNear,pcVar6,&aPoslist,(int *)&p1,
                                   pFVar7->pPhrase);
        }
        sqlite3_free(pcVar6);
        if (iVar3 != 0) goto LAB_001b4b38;
      }
    }
    if ((pExpr->eType == 1) && ((pExpr->pParent == (Fts3Expr *)0x0 || (pExpr->pParent->eType != 1)))
       ) {
      for (; pExpr->pPhrase == (Fts3Phrase *)0x0; pExpr = pExpr->pLeft) {
        if (pExpr->pRight->iDocid == pCsr->iPrevId) {
          fts3EvalInvalidatePoslist(pExpr->pRight->pPhrase);
        }
      }
      if (pExpr->iDocid == pCsr->iPrevId) {
        fts3EvalInvalidatePoslist(pExpr->pPhrase);
      }
    }
    break;
  case 2:
    iVar3 = fts3EvalTestExpr(pCsr,pExpr->pLeft,pRc);
    if (iVar3 != 0) {
      iVar3 = fts3EvalTestExpr(pCsr,pExpr->pRight,pRc);
      bVar15 = iVar3 == 0;
      goto LAB_001b4b38;
    }
    break;
  case 4:
    iVar3 = fts3EvalTestExpr(pCsr,pExpr->pLeft,pRc);
    iVar10 = fts3EvalTestExpr(pCsr,pExpr->pRight,pRc);
    bVar15 = iVar10 != 0 || iVar3 != 0;
    goto LAB_001b4b38;
  default:
    if (pCsr->pDeferred != (Fts3DeferredToken *)0x0) {
      if (pExpr->bDeferred == '\0') {
        if ((pExpr->iDocid != pCsr->iPrevId) ||
           (pFVar9 = pExpr->pPhrase, (pFVar9->doclist).pList == (char *)0x0)) goto LAB_001b47d3;
      }
      else {
        pFVar9 = pExpr->pPhrase;
        fts3EvalInvalidatePoslist(pFVar9);
      }
      __n = 0;
      if ((pFVar9->doclist).bFreeList == 0) {
        local_70 = (char *)0x0;
      }
      else {
        local_70 = (pFVar9->doclist).pList;
      }
      ppFVar8 = &pFVar9->aToken[0].pDeferred;
      uVar12 = 0xffffffffffffffff;
      pcVar6 = (char *)0x0;
      for (uVar14 = 0; uVar13 = (uint)uVar12, (long)uVar14 < (long)pFVar9->nToken;
          uVar14 = uVar14 + 1) {
        pFVar2 = *ppFVar8;
        pcVar5 = pcVar6;
        if (pFVar2 != (Fts3DeferredToken *)0x0) {
          if (pFVar2->pList == (PendingList *)0x0) {
LAB_001b4992:
            sqlite3_free(pcVar5);
            sqlite3_free(local_70);
            (pFVar9->doclist).pList = (char *)0x0;
            (pFVar9->doclist).nList = 0;
            iVar3 = 0;
            goto LAB_001b4baa;
          }
          pcVar5 = (char *)sqlite3_malloc64((long)pFVar2->pList->nData);
          if (pcVar5 == (char *)0x0) {
            iVar3 = 7;
            goto LAB_001b4baa;
          }
          iVar3 = sqlite3Fts3GetVarintU(pFVar2->pList->aData,(sqlite_uint64 *)&aPoslist);
          __n = (long)pFVar2->pList->nData - (long)iVar3;
          memcpy(pcVar5,pFVar2->pList->aData + iVar3,__n);
          if (pcVar6 != (char *)0x0) {
            p2 = pcVar5;
            p1 = pcVar6;
            aPoslist = pcVar5;
            fts3PoslistPhraseMerge(&aPoslist,(int)uVar14 - uVar13,0,1,&p1,&p2);
            sqlite3_free(pcVar6);
            uVar13 = (int)aPoslist - (int)pcVar5;
            __n = (size_t)uVar13;
            if (uVar13 == 0) goto LAB_001b4992;
          }
          uVar12 = uVar14 & 0xffffffff;
        }
        ppFVar8 = ppFVar8 + 5;
        pcVar6 = pcVar5;
      }
      if ((int)uVar13 < 0) {
LAB_001b4b8f:
        iVar3 = 0;
        if ((pFVar9->doclist).pList != local_70) {
          sqlite3_free(local_70);
        }
      }
      else {
        uVar1 = pFVar9->iDoclistToken;
        if ((int)uVar1 < 0) {
          (pFVar9->doclist).pList = pcVar6;
          (pFVar9->doclist).nList = (int)__n;
          (pFVar9->doclist).iDocid = pCsr->iPrevId;
          (pFVar9->doclist).bFreeList = 1;
          goto LAB_001b4b8f;
        }
        pcVar5 = (pFVar9->doclist).pList;
        p1 = pcVar5;
        aPoslist = pcVar6;
        if (uVar1 <= uVar13) {
          p1 = pcVar6;
          aPoslist = pcVar5;
        }
        p2 = (char *)sqlite3Fts3MallocZero((long)((int)__n + 8));
        if (p2 != (char *)0x0) {
          iVar3 = uVar13 - uVar1;
          if (uVar13 < uVar1) {
            iVar3 = -(uVar13 - uVar1);
          }
          (pFVar9->doclist).pList = p2;
          iVar10 = 0;
          iVar3 = fts3PoslistPhraseMerge(&p2,iVar3,0,1,&aPoslist,&p1);
          if (iVar3 == 0) {
            sqlite3_free(p2);
            (pFVar9->doclist).pList = (char *)0x0;
          }
          else {
            (pFVar9->doclist).bFreeList = 1;
            iVar10 = (int)p2 - *(int *)&(pFVar9->doclist).pList;
          }
          (pFVar9->doclist).nList = iVar10;
          sqlite3_free(pcVar6);
          goto LAB_001b4b8f;
        }
        sqlite3_free(pcVar6);
        iVar3 = 7;
      }
LAB_001b4baa:
      *pRc = iVar3;
      bVar15 = (pFVar9->doclist).pList != (char *)0x0;
      pExpr->iDocid = pCsr->iPrevId;
      goto LAB_001b4b38;
    }
LAB_001b47d3:
    if ((pExpr->bEof == '\0') && (pExpr->iDocid == pCsr->iPrevId)) {
      bVar15 = 0 < (pExpr->pPhrase->doclist).nList;
      goto LAB_001b4b38;
    }
  }
  bVar15 = false;
LAB_001b4b38:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)bVar15;
  }
  __stack_chk_fail();
}

Assistant:

static int fts3EvalTestExpr(
  Fts3Cursor *pCsr,               /* FTS cursor handle */
  Fts3Expr *pExpr,                /* Expr to test. May or may not be root. */
  int *pRc                        /* IN/OUT: Error code */
){
  int bHit = 1;                   /* Return value */
  if( *pRc==SQLITE_OK ){
    switch( pExpr->eType ){
      case FTSQUERY_NEAR:
      case FTSQUERY_AND:
        bHit = (
            fts3EvalTestExpr(pCsr, pExpr->pLeft, pRc)
         && fts3EvalTestExpr(pCsr, pExpr->pRight, pRc)
         && fts3EvalNearTest(pExpr, pRc)
        );

        /* If the NEAR expression does not match any rows, zero the doclist for
        ** all phrases involved in the NEAR. This is because the snippet(),
        ** offsets() and matchinfo() functions are not supposed to recognize
        ** any instances of phrases that are part of unmatched NEAR queries.
        ** For example if this expression:
        **
        **    ... MATCH 'a OR (b NEAR c)'
        **
        ** is matched against a row containing:
        **
        **        'a b d e'
        **
        ** then any snippet() should ony highlight the "a" term, not the "b"
        ** (as "b" is part of a non-matching NEAR clause).
        */
        if( bHit==0
         && pExpr->eType==FTSQUERY_NEAR
         && (pExpr->pParent==0 || pExpr->pParent->eType!=FTSQUERY_NEAR)
        ){
          Fts3Expr *p;
          for(p=pExpr; p->pPhrase==0; p=p->pLeft){
            if( p->pRight->iDocid==pCsr->iPrevId ){
              fts3EvalInvalidatePoslist(p->pRight->pPhrase);
            }
          }
          if( p->iDocid==pCsr->iPrevId ){
            fts3EvalInvalidatePoslist(p->pPhrase);
          }
        }

        break;

      case FTSQUERY_OR: {
        int bHit1 = fts3EvalTestExpr(pCsr, pExpr->pLeft, pRc);
        int bHit2 = fts3EvalTestExpr(pCsr, pExpr->pRight, pRc);
        bHit = bHit1 || bHit2;
        break;
      }

      case FTSQUERY_NOT:
        bHit = (
            fts3EvalTestExpr(pCsr, pExpr->pLeft, pRc)
         && !fts3EvalTestExpr(pCsr, pExpr->pRight, pRc)
        );
        break;

      default: {
#ifndef SQLITE_DISABLE_FTS4_DEFERRED
        if( pCsr->pDeferred && (pExpr->bDeferred || (
            pExpr->iDocid==pCsr->iPrevId && pExpr->pPhrase->doclist.pList
        ))){
          Fts3Phrase *pPhrase = pExpr->pPhrase;
          if( pExpr->bDeferred ){
            fts3EvalInvalidatePoslist(pPhrase);
          }
          *pRc = fts3EvalDeferredPhrase(pCsr, pPhrase);
          bHit = (pPhrase->doclist.pList!=0);
          pExpr->iDocid = pCsr->iPrevId;
        }else
#endif
        {
          bHit = (
              pExpr->bEof==0 && pExpr->iDocid==pCsr->iPrevId
           && pExpr->pPhrase->doclist.nList>0
          );
        }
        break;
      }
    }
  }
  return bHit;
}